

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.C
# Opt level: O0

bool anon_unknown.dwarf_18c8::verifyGrammar(char *v)

{
  int iVar1;
  bool local_11;
  char *v_local;
  
  iVar1 = strcmp(v,"ECMAScript");
  local_11 = true;
  if (iVar1 != 0) {
    iVar1 = strcmp(v,"basic");
    local_11 = true;
    if (iVar1 != 0) {
      iVar1 = strcmp(v,"extended");
      local_11 = true;
      if (iVar1 != 0) {
        iVar1 = strcmp(v,"awk");
        local_11 = true;
        if (iVar1 != 0) {
          iVar1 = strcmp(v,"grep");
          local_11 = true;
          if (iVar1 != 0) {
            iVar1 = strcmp(v,"egrep");
            local_11 = iVar1 == 0;
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool verifyGrammar(char const * v)
    {
        return (strcmp(v, "ECMAScript") == 0 ||
                strcmp(v, "basic") == 0 ||
                strcmp(v, "extended") == 0 ||
                strcmp(v, "awk") == 0 ||
                strcmp(v, "grep") == 0 ||
                strcmp(v, "egrep") == 0);
    }